

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O3

string * __thiscall
Logger::format_timestamp_abi_cxx11_(string *__return_storage_ptr__,Logger *this,unsigned_long ts)

{
  undefined1 auVar1 [16];
  ostream *poVar2;
  ostream *poVar3;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar2 = (ostream *)std::ostream::operator<<(local_1a0,(int)((ulong)this / 0xe10));
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," hours ",7);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (ulong)this / 0x3c;
  poVar2 = (ostream *)
           std::ostream::operator<<
                     (poVar2,(int)((ulong)this / 0x3c) +
                             (SUB164(auVar1 * ZEXT816(0x888888888888889),8) >> 1) * -0x3c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," minutes ",9);
  poVar3 = (ostream *)std::ostream::operator<<(poVar2,(int)((ulong)this % 0x3c));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," seconds",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

std::string Logger::format_timestamp(unsigned long ts) {
  auto minutes = ts/60;
  auto hours = minutes/60;
  std::stringstream ss;
  ss << int(hours) << " hours "
     << int(minutes%60) << " minutes "
     << int(ts%60) << " seconds";
  return ss.str();
}